

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_verify_helper
              (secp256k1_context *ctx,secp256k1_ge *result,secp256k1_scalar *sigr,
              secp256k1_scalar *sigs,secp256k1_ge *pubkey,secp256k1_scalar *message)

{
  int iVar1;
  undefined1 local_1a0 [8];
  secp256k1_gej pr;
  secp256k1_gej pubkeyj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_scalar *message_local;
  secp256k1_ge *pubkey_local;
  secp256k1_scalar *sigs_local;
  secp256k1_scalar *sigr_local;
  secp256k1_ge *result_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_scalar_is_zero(sigr);
  if ((iVar1 == 0) && (iVar1 = secp256k1_scalar_is_zero(sigs), iVar1 == 0)) {
    secp256k1_scalar_inverse_var((secp256k1_scalar *)(u1.d + 3),sigs);
    secp256k1_scalar_mul((secp256k1_scalar *)(u2.d + 3),(secp256k1_scalar *)(u1.d + 3),message);
    secp256k1_scalar_mul((secp256k1_scalar *)&pubkeyj.infinity,(secp256k1_scalar *)(u1.d + 3),sigr);
    secp256k1_gej_set_ge((secp256k1_gej *)&pr.infinity,pubkey);
    secp256k1_ecmult(&ctx->ecmult_ctx,(secp256k1_gej *)local_1a0,(secp256k1_gej *)&pr.infinity,
                     (secp256k1_scalar *)&pubkeyj.infinity,(secp256k1_scalar *)(u2.d + 3));
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)local_1a0);
    if (iVar1 != 0) {
      return 0;
    }
    secp256k1_ge_set_gej(result,(secp256k1_gej *)local_1a0);
    return 1;
  }
  return 0;
}

Assistant:

SECP256K1_API int secp256k1_ecdsa_adaptor_sig_verify_helper(const secp256k1_context* ctx, secp256k1_ge *result, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);

    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&ctx->ecmult_ctx, &pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }
    secp256k1_ge_set_gej(result, &pr);
    return 1;
}